

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall
Clara::CommandLine<Catch::ConfigData>::CommandLine(CommandLine<Catch::ConfigData> *this)

{
  _Rb_tree_header *p_Var1;
  IArgFunction<Catch::ConfigData> *pIVar2;
  
  pIVar2 = (IArgFunction<Catch::ConfigData> *)operator_new(8);
  pIVar2->_vptr_IArgFunction = (_func_int **)&PTR__IArgFunction_001587d0;
  (this->m_boundProcessName).functionObj = pIVar2;
  (this->m_options).
  super__Vector_base<Clara::CommandLine<Catch::ConfigData>::Arg,_std::allocator<Clara::CommandLine<Catch::ConfigData>::Arg>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_options).
  super__Vector_base<Clara::CommandLine<Catch::ConfigData>::Arg,_std::allocator<Clara::CommandLine<Catch::ConfigData>::Arg>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_options).
  super__Vector_base<Clara::CommandLine<Catch::ConfigData>::Arg,_std::allocator<Clara::CommandLine<Catch::ConfigData>::Arg>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_positionalArgs)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_positionalArgs)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var1 = &(this->m_positionalArgs)._M_t._M_impl.super__Rb_tree_header;
  (this->m_positionalArgs)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header
  ;
  (this->m_positionalArgs)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->m_positionalArgs)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->m_arg)._M_ptr = (Arg *)0x0;
  this->m_highestSpecifiedArgPosition = 0;
  return;
}

Assistant:

CommandLine()
        :   m_boundProcessName( new Detail::NullBinder<ConfigT>() ),
            m_highestSpecifiedArgPosition( 0 )
        {}